

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::SocketClientBase(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                   *this,string *host_port_path,unsigned_short default_port)

{
  ScopeRunner *this_00;
  string local_90 [32];
  string local_70;
  undefined1 local_50 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  host_port;
  size_type host_port_end;
  unsigned_short default_port_local;
  string *host_port_path_local;
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  this->_vptr_SocketClientBase = (_func_int **)&PTR__SocketClientBase_004683a0;
  Config::Config(&this->config);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>)>
  ::function(&this->on_open);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>,_std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage>)>
  ::function(&this->on_message);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->on_close);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>,_const_std::error_code_&)>
  ::function(&this->on_error);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>)>
  ::function(&this->on_ping);
  std::
  function<void_(std::shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>)>
  ::function(&this->on_pong);
  std::shared_ptr<asio::io_context>::shared_ptr(&this->io_service);
  std::mutex::mutex(&this->start_stop_mutex);
  this->internal_io_service = false;
  std::__cxx11::string::string((string *)&this->host);
  this->default_port = default_port;
  std::__cxx11::string::string((string *)&this->path);
  Mutex::Mutex(&this->connection_mutex);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::shared_ptr(&this->connection);
  this_00 = (ScopeRunner *)operator_new(8);
  ScopeRunner::ScopeRunner(this_00);
  std::shared_ptr<SimpleWeb::ScopeRunner>::shared_ptr<SimpleWeb::ScopeRunner,void>
            (&this->handler_runner,this_00);
  host_port._32_8_ = std::__cxx11::string::find((char)host_port_path,0x2f);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)host_port_path);
  parse_host_port((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                   *)local_50,this,&local_70,default_port);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::operator=((string *)&this->host,(string *)local_50);
  this->port = host_port.first.field_2._8_2_;
  if (host_port._32_8_ == -1) {
    std::__cxx11::string::operator=((string *)&this->path,"/");
  }
  else {
    std::__cxx11::string::substr((ulong)local_90,(ulong)host_port_path);
    std::__cxx11::string::operator=((string *)&this->path,local_90);
    std::__cxx11::string::~string(local_90);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
           *)local_50);
  return;
}

Assistant:

SocketClientBase(const std::string &host_port_path, unsigned short default_port) noexcept : default_port(default_port), handler_runner(new ScopeRunner()) {
      auto host_port_end = host_port_path.find('/');
      auto host_port = parse_host_port(host_port_path.substr(0, host_port_end), default_port);
      host = std::move(host_port.first);
      port = host_port.second;

      if(host_port_end != std::string::npos)
        path = host_port_path.substr(host_port_end);
      else
        path = "/";
    }